

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

parser_error parse_monster_shape(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  undefined8 *puVar3;
  char *pcVar4;
  monster_base *pmVar5;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    puVar3 = (undefined8 *)mem_zalloc(0x20);
    pcVar4 = parser_getstr(p,"name");
    pcVar4 = string_make(pcVar4);
    puVar3[1] = pcVar4;
    pmVar5 = lookup_monster_base(pcVar4);
    puVar3[3] = pmVar5;
    *puVar3 = *(undefined8 *)((long)pvVar2 + 0xc0);
    *(undefined8 **)((long)pvVar2 + 0xc0) = puVar3;
    *(int *)((long)pvVar2 + 200) = *(int *)((long)pvVar2 + 200) + 1;
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_monster_shape(struct parser *p) {
	struct monster_race *r = parser_priv(p);
	struct monster_shape *s;

	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	s = mem_zalloc(sizeof *s);
	s->name = string_make(parser_getstr(p, "name"));
	s->base = lookup_monster_base(s->name);
	s->next = r->shapes;
	r->shapes = s;
	r->num_shapes++;

	return PARSE_ERROR_NONE;
}